

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O0

void __thiscall
gms_matcher::NormalizePoints
          (gms_matcher *this,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *kp,Size *size,
          vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *npts)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_type __new_size;
  const_reference pvVar4;
  reference pvVar5;
  ulong local_40;
  size_t i;
  int height;
  int width;
  size_t numP;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *npts_local;
  Size *size_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *kp_local;
  gms_matcher *this_local;
  
  __new_size = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::size(kp);
  iVar2 = size->width;
  iVar3 = size->height;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::resize(npts,__new_size);
  for (local_40 = 0; local_40 < __new_size; local_40 = local_40 + 1) {
    pvVar4 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::operator[](kp,local_40);
    fVar1 = *(float *)pvVar4;
    pvVar5 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                       (npts,local_40);
    pvVar5->x = fVar1 / (float)iVar2;
    pvVar4 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::operator[](kp,local_40);
    fVar1 = *(float *)(pvVar4 + 4);
    pvVar5 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                       (npts,local_40);
    pvVar5->y = fVar1 / (float)iVar3;
  }
  return;
}

Assistant:

void NormalizePoints(const vector<KeyPoint> &kp, const Size &size, vector<Point2f> &npts) {
		const size_t numP = kp.size();
		const int width   = size.width;
		const int height  = size.height;
		npts.resize(numP);

		for (size_t i = 0; i < numP; i++)
		{
			npts[i].x = kp[i].pt.x / width;
			npts[i].y = kp[i].pt.y / height;
		}
	}